

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O3

void __thiscall
t_rb_generator::generate_rb_function_helpers(t_rb_generator *this,t_function *tfunction)

{
  size_type *psVar1;
  t_program *program;
  pointer pcVar2;
  t_type *type;
  t_struct *ptVar3;
  int iVar4;
  pointer pptVar5;
  t_field success;
  t_struct result;
  string local_1c0;
  t_field local_1a0;
  t_struct local_f0;
  
  program = (this->super_t_oop_generator).super_t_generator.program_;
  psVar1 = &local_1a0.super_t_doc.doc_._M_string_length;
  pcVar2 = (tfunction->name_)._M_dataplus._M_p;
  local_1a0.super_t_doc._vptr_t_doc = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,pcVar2,pcVar2 + (tfunction->name_)._M_string_length);
  std::__cxx11::string::append((char *)&local_1a0);
  t_struct::t_struct(&local_f0,program,(string *)&local_1a0);
  if (local_1a0.super_t_doc._vptr_t_doc != (_func_int **)psVar1) {
    operator_delete(local_1a0.super_t_doc._vptr_t_doc);
  }
  type = tfunction->returntype_;
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"success","");
  t_field::t_field(&local_1a0,type,&local_1c0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  iVar4 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
  if ((char)iVar4 == '\0') {
    t_struct::append(&local_f0,&local_1a0);
  }
  ptVar3 = tfunction->xceptions_;
  pptVar5 = (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar5 !=
      (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      t_struct::append(&local_f0,*pptVar5);
      pptVar5 = pptVar5 + 1;
    } while (pptVar5 !=
             (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  generate_rb_struct(this,&this->f_service_,&local_f0,false);
  t_field::~t_field(&local_1a0);
  local_f0.super_t_type.super_t_doc._vptr_t_doc = (_func_int **)&PTR__t_struct_0040eeb8;
  if (local_f0.members_in_id_order_.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.members_in_id_order_.
                    super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_f0.members_.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.members_.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  t_type::~t_type(&local_f0.super_t_type);
  return;
}

Assistant:

void t_rb_generator::generate_rb_function_helpers(t_function* tfunction) {
  t_struct result(program_, tfunction->get_name() + "_result");
  t_field success(tfunction->get_returntype(), "success", 0);
  if (!tfunction->get_returntype()->is_void()) {
    result.append(&success);
  }

  t_struct* xs = tfunction->get_xceptions();
  const vector<t_field*>& fields = xs->get_members();
  vector<t_field*>::const_iterator f_iter;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    result.append(*f_iter);
  }
  generate_rb_struct(f_service_, &result);
}